

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.h
# Opt level: O1

void __thiscall Ptex::v2_2::PtexReaderCache::~PtexReaderCache(PtexReaderCache *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_PtexCache)._vptr_PtexCache = (_func_int **)&PTR__PtexReaderCache_02d152a8;
  pthread_mutex_destroy((pthread_mutex_t *)&this->_mruLock);
  PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::~PtexHashMap(&this->_files);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->_searchdirs);
  pcVar1 = (this->_searchpath)._M_dataplus._M_p;
  paVar2 = &(this->_searchpath).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~PtexReaderCache()
    {}